

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.hpp
# Opt level: O1

void __thiscall helics::apps::WebServer::WebServer(WebServer *this,string_view server_name)

{
  (this->super_TypedBrokerServer)._vptr_TypedBrokerServer = (_func_int **)&PTR__WebServer_0054f880;
  (this->running)._M_base._M_i = false;
  (this->context).super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->context).super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mainLoopThread)._M_id._M_thread = 0;
  (this->threadGuard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->threadGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->threadGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->threadGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->threadGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->config = (json *)0x0;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->mName,server_name._M_str,server_name._M_str + server_name._M_len);
  (this->mArgs)._M_dataplus._M_p = (pointer)&(this->mArgs).field_2;
  (this->mArgs)._M_string_length = 0;
  (this->mArgs).field_2._M_local_buf[0] = '\0';
  (this->mHttpAddress)._M_dataplus._M_p = (pointer)&(this->mHttpAddress).field_2;
  (this->mHttpAddress)._M_string_length = 0;
  (this->mHttpAddress).field_2._M_local_buf[0] = '\0';
  this->mHttpPort = 0xaa16;
  (this->mWebsocketAddress)._M_dataplus._M_p = (pointer)&(this->mWebsocketAddress).field_2;
  (this->mWebsocketAddress)._M_string_length = 0;
  (this->mWebsocketAddress).field_2._M_local_buf[0] = '\0';
  this->mWebsocketPort = 0xaa17;
  this->mHttpEnabled = false;
  this->mWebsocketEnabled = false;
  this->mInterfaceNetwork = 0;
  (this->executing)._M_base._M_i = false;
  return;
}

Assistant:

explicit WebServer(std::string_view server_name): mName(server_name) {}